

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall CLI::App::add_flag(App *this,string *flag_name)

{
  Option *pOVar1;
  string local_78;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  local_58;
  string local_38;
  string *local_18;
  string *flag_name_local;
  App *this_local;
  
  local_18 = flag_name;
  flag_name_local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_38,(string *)flag_name);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(&local_58);
  ::std::__cxx11::string::string((string *)&local_78);
  pOVar1 = _add_flag_internal(this,&local_38,&local_58,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return pOVar1;
}

Assistant:

Option *add_flag(std::string flag_name) { return _add_flag_internal(flag_name, CLI::callback_t(), std::string{}); }